

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O0

void save_oracles(memfile *mf)

{
  uint local_14;
  int i;
  memfile *mf_local;
  
  mtag(mf,0,MTAG_ORACLES);
  mwrite32(mf,oracle_cnt);
  if (oracle_cnt != 0) {
    for (local_14 = 0; local_14 < oracle_cnt; local_14 = local_14 + 1) {
      mwrite32(mf,oracle_loc[(int)local_14]);
    }
  }
  return;
}

Assistant:

void save_oracles(struct memfile *mf)
{
	int i;
	mtag(mf, 0, MTAG_ORACLES);
	mwrite32(mf, oracle_cnt);
	if (oracle_cnt)
	    for (i = 0; i < oracle_cnt; i++)
		mwrite32(mf, oracle_loc[i]);
}